

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FS.cpp
# Opt level: O2

int File::copy(string *from,string *to)

{
  int iVar1;
  int iVar2;
  ofstream dst;
  ifstream src;
  streambuf local_218 [504];
  
  iVar1 = access((from->_M_dataplus)._M_p,0);
  iVar2 = iVar1;
  if (iVar1 == 0) {
    std::ifstream::ifstream(&src,(string *)from,_S_bin);
    std::ofstream::ofstream(&dst,(string *)to,_S_bin);
    std::ostream::operator<<((ostream *)&dst,local_218);
    std::ofstream::~ofstream(&dst);
    iVar2 = std::ifstream::~ifstream(&src);
  }
  return CONCAT31((int3)((uint)iVar2 >> 8),iVar1 == 0);
}

Assistant:

bool File::copy (const std::string& from, const std::string& to)
{
  // 'from' must exist.
  if (! access (from.c_str (), F_OK))
  {
    std::ifstream src (from, std::ios::binary);
    std::ofstream dst (to,   std::ios::binary);

    dst << src.rdbuf ();
    return true;
  }

  return false;
}